

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<long_long>::emplace<long_long&>
          (QPodArrayOps<long_long> *this,qsizetype i,longlong *args)

{
  qsizetype *pqVar1;
  Data *pDVar2;
  longlong lVar3;
  longlong *plVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<long_long>).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_001900e5:
    lVar3 = *args;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<long_long>).size != 0);
    QArrayDataPointer<long_long>::detachAndGrow
              (&this->super_QArrayDataPointer<long_long>,where,1,(longlong **)0x0,
               (QArrayDataPointer<long_long> *)0x0);
    plVar4 = createHole(this,where,i,1);
    *plVar4 = lVar3;
  }
  else {
    if (((this->super_QArrayDataPointer<long_long>).size == i) &&
       (plVar4 = (this->super_QArrayDataPointer<long_long>).ptr,
       (pDVar2->super_QArrayData).alloc !=
       ((long)((long)plVar4 -
              ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      plVar4[i] = *args;
    }
    else {
      if ((i != 0) ||
         (plVar4 = (this->super_QArrayDataPointer<long_long>).ptr,
         (longlong *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         plVar4)) goto LAB_001900e5;
      plVar4[-1] = *args;
      (this->super_QArrayDataPointer<long_long>).ptr = plVar4 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<long_long>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }